

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O2

REF_STATUS ref_dict_location(REF_DICT ref_dict,REF_INT key,REF_INT *location)

{
  uint uVar1;
  REF_STATUS RVar2;
  ulong uVar3;
  
  if (10 < ref_dict->n) {
    RVar2 = ref_sort_search_int(ref_dict->n,ref_dict->key,key,location);
    return RVar2;
  }
  *location = -1;
  uVar3 = 0;
  uVar1 = ref_dict->n;
  if (ref_dict->n < 1) {
    uVar1 = 0;
  }
  while( true ) {
    if (uVar1 == uVar3) {
      return 5;
    }
    if (ref_dict->key[uVar3] == key) break;
    uVar3 = uVar3 + 1;
  }
  *location = (REF_INT)uVar3;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_dict_location(REF_DICT ref_dict, REF_INT key,
                                     REF_INT *location) {
  REF_INT i;

  if (10 < ref_dict_n(ref_dict)) {
    return ref_sort_search_int(ref_dict_n(ref_dict), ref_dict->key, key,
                               location);
  } else {
    *location = REF_EMPTY;

    for (i = 0; i < ref_dict_n(ref_dict); i++)
      if (key == ref_dict->key[i]) {
        *location = i;
        return REF_SUCCESS;
      }
  }
  return REF_NOT_FOUND;
}